

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
booster::locale::ngettext<wchar_t>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,wchar_t *s,wchar_t *p,int n,locale *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar3;
  basic_message<wchar_t> local_a0;
  
  paVar1 = &local_a0.id_.field_2;
  local_a0.c_context_ = (char_type_conflict *)0x0;
  local_a0.id_._M_string_length = 0;
  local_a0.id_.field_2._M_local_buf[0] = L'\0';
  paVar2 = &local_a0.context_.field_2;
  local_a0.context_._M_string_length = 0;
  local_a0.context_.field_2._M_local_buf[0] = L'\0';
  paVar3 = &local_a0.plural_.field_2;
  local_a0.plural_._M_string_length = 0;
  local_a0.plural_.field_2._M_local_buf[0] = L'\0';
  local_a0.n_ = n;
  local_a0.c_id_ = s;
  local_a0.c_plural_ = p;
  local_a0.id_._M_dataplus._M_p = (pointer)paVar1;
  local_a0.context_._M_dataplus._M_p = (pointer)paVar2;
  local_a0.plural_._M_dataplus._M_p = (pointer)paVar3;
  basic_message<wchar_t>::str_abi_cxx11_(__return_storage_ptr__,&local_a0,loc,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a0.plural_._M_dataplus._M_p != paVar3) {
    operator_delete(local_a0.plural_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a0.context_._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0.context_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a0.id_._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.id_._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharType> ngettext(   CharType const *s,
                                                CharType const *p,
                                                int n,
                                                std::locale const &loc=std::locale())
        {
            return basic_message<CharType>(s,p,n).str(loc);
        }